

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O0

Pipeline * __thiscall
n_e_s::core::Mos6502::create_left_shift_instruction
          (Pipeline *__return_storage_ptr__,Mos6502 *this,Opcode opcode,bool shift_in_carry)

{
  Family family;
  undefined1 local_e8 [16];
  AddressMode local_d8;
  bool local_d4;
  StepT local_d0;
  Pipeline local_a0;
  undefined1 local_41;
  MemoryAccess local_40;
  byte local_39;
  MemoryAccess memory_access;
  bool shift_in_carry_local;
  Mos6502 *this_local;
  AddressMode local_28;
  Mos6502 *local_20;
  Opcode opcode_local;
  Pipeline *result;
  
  local_28 = opcode.address_mode;
  this_local = opcode._0_8_;
  local_20._0_4_ = opcode.family;
  family = (Family)local_20;
  local_39 = shift_in_carry;
  _memory_access = this;
  local_20 = this_local;
  opcode_local.family = local_28;
  unique0x1000010d = __return_storage_ptr__;
  local_40 = get_memory_access(family);
  local_41 = 0;
  Pipeline::Pipeline(__return_storage_ptr__);
  create_addressing_steps(&local_a0,this,opcode_local.family,local_40);
  Pipeline::append(__return_storage_ptr__,&local_a0);
  Pipeline::~Pipeline(&local_a0);
  local_d8 = opcode_local.family;
  local_e8._8_8_ = local_20;
  local_d4 = (bool)(local_39 & 1);
  local_e8._0_8_ = this;
  std::function<void()>::
  function<n_e_s::core::Mos6502::create_left_shift_instruction(n_e_s::core::Opcode,bool)::__0,void>
            ((function<void()> *)&local_d0,(anon_class_24_3_d8814e11 *)local_e8);
  Pipeline::push(__return_storage_ptr__,&local_d0);
  std::function<void_()>::~function(&local_d0);
  return __return_storage_ptr__;
}

Assistant:

Pipeline Mos6502::create_left_shift_instruction(Opcode opcode,
        bool shift_in_carry) {
    const MemoryAccess memory_access = get_memory_access(opcode.family);
    Pipeline result;
    result.append(create_addressing_steps(opcode.address_mode, memory_access));

    result.push([this, opcode, shift_in_carry] {
        const uint8_t source_value =
                opcode.address_mode == AddressMode::Accumulator ? registers_->a
                                                                : tmp_;

        uint16_t temp_result = source_value << 1u;
        if (shift_in_carry) {
            const uint8_t carry = registers_->p & C_FLAG ? 0x01u : 0x00u;
            temp_result |= carry;
        }
        const auto result_8bit = static_cast<uint8_t>(temp_result);
        set_carry(temp_result > 0xFF);
        set_zero(result_8bit);
        set_negative(result_8bit);

        if (opcode.address_mode == AddressMode::Accumulator) {
            registers_->a = result_8bit;
        } else {
            mmu_->write_byte(effective_address_, result_8bit);
        }
    });
    return result;
}